

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
defyx::AssemblyGeneratorX86::h_IADD_RS(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *this_00;
  undefined1 *this_01;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  this_01 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tlea ",5);
  pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", [",3);
  pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"+",1);
  pcVar2 = *(char **)(regR + (ulong)instr->src * 8);
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar2,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"*",1);
  this_00 = (ostream *)std::ostream::operator<<(this_01,1 << (instr->mod >> 2 & 3));
  if (bVar1 == 5) {
    *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
         *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) | 0x800;
    this_00 = (ostream *)std::ostream::operator<<(this_00,instr->imm32);
    *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
         *(uint *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xfffff7ff;
  }
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
  std::ostream::put((char)this_00);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IADD_RS(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if(instr.dst == RegisterNeedsDisplacement)
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << std::showpos << (int32_t)instr.getImm32() << std::noshowpos << "]" << std::endl;
		else
			asmCode << "\tlea " << regR[instr.dst] << ", [" << regR[instr.dst] << "+" << regR[instr.src] << "*" << (1 << (instr.getModShift())) << "]" << std::endl;
		traceint(instr);
	}